

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdditionExpression.hpp
# Opt level: O2

string * __thiscall
Kandinsky::AdditionExpression::toString_abi_cxx11_
          (string *__return_storage_ptr__,AdditionExpression *this,bool evaluate)

{
  element_type *peVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*((this->super_BinaryExpression).m_arg1.
     super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_BaseExpression[5])(&local_40);
  std::operator+(&local_a0,"(",&local_40);
  std::operator+(&local_80,&local_a0," + ");
  peVar1 = (this->super_BinaryExpression).m_arg2.
           super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_BaseExpression[5])(&local_c0,peVar1,evaluate);
  std::operator+(&local_60,&local_80,&local_c0);
  std::operator+(__return_storage_ptr__,&local_60,")");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString(bool evaluate = false) const
        {
            return "(" + m_arg1->toString(evaluate) + " + " + m_arg2->toString(evaluate) + ")";
        }